

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::email::email(email *this)

{
  allocator local_31;
  string local_30;
  
  base_widget::base_widget
            ((base_widget *)&(this->super_regex_field).super_text.super_base_html_input.field_0xa0);
  std::__cxx11::string::string((string *)&local_30,"^[^@]+@[^@]+$",&local_31);
  regex_field::regex_field(&this->super_regex_field,&PTR_construction_vtable_24__002b4f70,&local_30)
  ;
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_regex_field).super_text.super_base_html_input._vptr_base_html_input =
       (_func_int **)0x2b4e58;
  *(undefined8 *)&(this->super_regex_field).super_text.super_base_html_input.field_0xa0 = 0x2b4f18;
  *(undefined8 *)&(this->super_regex_field).super_text.super_base_html_input.field_0x30 = 0x2b4ea0;
  *(undefined8 *)&(this->super_regex_field).super_text.super_base_html_input.field_0x98 = 0;
  return;
}

Assistant:

email::email() : regex_field("^[^@]+@[^@]+$") {}